

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::SlopesEqual(TEdge *e1,TEdge *e2,bool UseFullInt64Range)

{
  Int128 local_88;
  Int128 local_78;
  Int128 local_68;
  Int128 local_58;
  Int128 local_48;
  Int128 local_38;
  undefined1 local_21;
  TEdge *pTStack_20;
  bool UseFullInt64Range_local;
  TEdge *e2_local;
  TEdge *e1_local;
  
  if (UseFullInt64Range) {
    local_21 = UseFullInt64Range;
    pTStack_20 = e2;
    e2_local = e1;
    Int128::Int128(&local_48,e1->ytop - e1->ybot);
    Int128::Int128(&local_58,pTStack_20->xtop - pTStack_20->xbot);
    Int128::operator*(&local_38,&local_48);
    Int128::Int128(&local_78,e2_local->xtop - e2_local->xbot);
    Int128::Int128(&local_88,pTStack_20->ytop - pTStack_20->ybot);
    Int128::operator*(&local_68,&local_78);
    e1_local._7_1_ = Int128::operator==(&local_38,&local_68);
  }
  else {
    e1_local._7_1_ =
         (e1->ytop - e1->ybot) * (e2->xtop - e2->xbot) -
         (e1->xtop - e1->xbot) * (e2->ytop - e2->ybot) == 0;
  }
  return e1_local._7_1_;
}

Assistant:

bool SlopesEqual(TEdge &e1, TEdge &e2, bool UseFullInt64Range)
{
  if (UseFullInt64Range)
    return Int128(e1.ytop - e1.ybot) * Int128(e2.xtop - e2.xbot) ==
      Int128(e1.xtop - e1.xbot) * Int128(e2.ytop - e2.ybot);
  else return (e1.ytop - e1.ybot)*(e2.xtop - e2.xbot) ==
      (e1.xtop - e1.xbot)*(e2.ytop - e2.ybot);
}